

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_codegen.c
# Opt level: O3

void visit_keyword_expr(gvisitor_t *self,gnode_keyword_expr_t *node)

{
  return;
}

Assistant:

static void visit_keyword_expr (gvisitor_t *self, gnode_keyword_expr_t *node) {
    DEBUG_CODEGEN("visit_keyword_expr %s", token_name(node->base.token.type));
    DECLARE_CODE();

    CODEGEN_COUNT_REGISTERS(n1);

    gtoken_t type = NODE_TOKEN_TYPE(node);
    switch (type) {
        case TOK_KEY_CURRFUNC:
			ircode_add_constant(code, CPOOL_VALUE_FUNC, LINE_NUMBER(node));
            break;

        case TOK_KEY_NULL:
			ircode_add_constant(code, CPOOL_VALUE_NULL, LINE_NUMBER(node));
            break;

        case TOK_KEY_SUPER:
            ircode_register_push(code, 0);
            break;

        case TOK_KEY_CURRARGS:
            // compiler can know in advance if arguments special array is used
            context_function->useargs = true;
			ircode_add_constant(code, CPOOL_VALUE_ARGUMENTS, LINE_NUMBER(node));
            break;

        case TOK_KEY_UNDEFINED:
			ircode_add_constant(code, CPOOL_VALUE_UNDEFINED, LINE_NUMBER(node));
            break;

        case TOK_KEY_TRUE:
			ircode_add_constant(code, CPOOL_VALUE_TRUE, LINE_NUMBER(node));
            break;

        case TOK_KEY_FALSE:
			ircode_add_constant(code, CPOOL_VALUE_FALSE, LINE_NUMBER(node));
            break;

        default:
            report_error(self, (gnode_t *)node, "Invalid keyword expression.");
            break;
    }

    CODEGEN_COUNT_REGISTERS(n2);
    CODEGEN_ASSERT_REGISTERS(n1, n2, 1);
}